

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_ialltoallv_(void *sendbuf,int *sendcounts,int *sdispls,MPIABI_Fint *sendtype,
                       void *recvbuf,int *recvcounts,int *rdispls,MPIABI_Fint *recvtype,
                       MPIABI_Fint *comm,MPIABI_Fint *request,MPIABI_Fint *ierror)

{
  mpi_ialltoallv_();
  return;
}

Assistant:

void mpiabi_ialltoallv_(
  const void * sendbuf,
  const int * sendcounts,
  const int * sdispls,
  const MPIABI_Fint * sendtype,
  void * recvbuf,
  const int * recvcounts,
  const int * rdispls,
  const MPIABI_Fint * recvtype,
  const MPIABI_Fint * comm,
  MPIABI_Fint * request,
  MPIABI_Fint * ierror
) {
  return mpi_ialltoallv_(
    sendbuf,
    sendcounts,
    sdispls,
    sendtype,
    recvbuf,
    recvcounts,
    rdispls,
    recvtype,
    comm,
    request,
    ierror
  );
}